

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

unsigned_long_long
ImGui::RoundScalarWithFormatT<unsigned_long_long>
          (char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *pcVar1;
  byte bVar2;
  byte *in_RAX;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  char *__nptr;
  double dVar8;
  char fmt_sanitized [32];
  char v_str [64];
  byte local_78 [31];
  char local_59;
  char local_58 [72];
  
  pbVar6 = local_78;
  do {
    bVar2 = *format;
    if (bVar2 == 0) {
      iVar5 = 3;
      pbVar3 = in_RAX;
    }
    else if ((bVar2 != 0x25) || (iVar5 = 1, pbVar3 = (byte *)format, ((byte *)format)[1] == 0x25)) {
      format = (char *)((byte *)format + (ulong)(bVar2 == 0x25) + 1);
      iVar5 = 0;
      pbVar3 = in_RAX;
    }
    in_RAX = pbVar3;
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    format = (char *)pbVar3;
  }
  if ((*format == 0x25) && (((byte *)format)[1] != 0x25)) {
    pbVar4 = (byte *)ImParseFormatFindEnd(format);
    pbVar3 = local_78;
    if (format < pbVar4) {
      do {
        pbVar6 = pbVar3;
        uVar7 = (byte)*format - 0x24;
        if ((0x3b < uVar7) || ((0x800000000000009U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
          *pbVar6 = *format;
          pbVar6 = pbVar6 + 1;
        }
        format = (char *)((byte *)format + 1);
        pbVar3 = pbVar6;
      } while ((byte *)format != pbVar4);
    }
    *pbVar6 = 0;
    ImFormatString(local_58,0x40,(char *)local_78,v);
    __nptr = &local_59;
    do {
      pcVar1 = __nptr + 1;
      __nptr = __nptr + 1;
    } while (*pcVar1 == ' ');
    dVar8 = atof(__nptr);
    v = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}